

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet.cpp
# Opt level: O3

void mpp_packet_set_pos(MppPacket packet,void *pos)

{
  MPP_RET MVar1;
  undefined8 in_RAX;
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  
  uVar6 = (undefined4)((ulong)in_RAX >> 0x20);
  MVar1 = check_is_mpp_packet_f(packet,"mpp_packet_set_pos");
  if (MVar1 == MPP_OK) {
    uVar3 = (long)pos - *(long *)((long)packet + 0x10);
    uVar2 = *(ulong *)((long)packet + 0x20) - uVar3;
    if (*(ulong *)((long)packet + 0x20) < uVar3) {
      pvVar4 = *(void **)((long)packet + 8);
      uVar2 = (long)pvVar4 + (*(long *)((long)packet + 0x18) - (long)pos);
    }
    else {
      pvVar4 = *(void **)((long)packet + 8);
    }
    *(ulong *)((long)packet + 0x20) = uVar2;
    *(void **)((long)packet + 0x10) = pos;
    if (pos < pvVar4) {
      uVar5 = CONCAT44(uVar6,0xd1);
      _mpp_log_l(2,"mpp_packet","Assertion %s failed at %s:%d\n",(char *)0x0,"p->data <= p->pos",
                 "mpp_packet_set_pos",uVar5);
      uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0015d30a;
      uVar2 = *(ulong *)((long)packet + 0x20);
    }
    if (*(ulong *)((long)packet + 0x18) < uVar2) {
      _mpp_log_l(2,"mpp_packet","Assertion %s failed at %s:%d\n",(char *)0x0,"p->size >= p->length",
                 "mpp_packet_set_pos",CONCAT44(uVar6,0xd2));
      if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_0015d30a:
        abort();
      }
    }
  }
  return;
}

Assistant:

void mpp_packet_set_pos(MppPacket packet, void *pos)
{
    if (check_is_mpp_packet(packet))
        return ;

    MppPacketImpl *p = (MppPacketImpl *)packet;
    size_t offset = (RK_U8 *)pos - (RK_U8 *)p->data;
    size_t diff = (RK_U8 *)pos - (RK_U8 *)p->pos;

    /*
     * If set pos is a simple update on original buffer update the length
     * If set pos setup a new buffer reset length to size - offset
     * This will avoid assert on change "data" in mpp_packet
     */
    if (diff <= p->length)
        p->length -= diff;
    else
        p->length = p->size - offset;

    p->pos = pos;
    mpp_assert(p->data <= p->pos);
    mpp_assert(p->size >= p->length);
}